

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

sat_solver * Ifn_ManStrFindSolver(Gia_Man_t *p,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars)

{
  int iVar1;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  lVar5 = 0;
  while (lVar5 < p_00->nClauses) {
    iVar1 = sat_solver_addclause(s,p_00->pClauses[lVar5],p_00->pClauses[lVar5 + 1]);
    lVar5 = lVar5 + 1;
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x260,
                    "sat_solver *Ifn_ManStrFindSolver(Gia_Man_t *, Vec_Int_t **, Vec_Int_t **)");
    }
  }
  iVar1 = p->nRegs;
  iVar6 = p->vCis->nSize - iVar1;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar4 = iVar6;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = piVar3;
  *pvPiVars = pVVar2;
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar2->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0043c4c7;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(*pvPiVars,p_00->pVarNums[iVar1]);
      lVar5 = lVar5 + 1;
      pVVar2 = p->vCis;
    } while (lVar5 < pVVar2->nSize);
    iVar1 = p->nRegs;
  }
  iVar1 = p->vCos->nSize - iVar1;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = piVar3;
  *pvPoVars = pVVar2;
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      iVar1 = pVVar2->pArray[lVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0043c4c7:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(*pvPoVars,p_00->pVarNums[iVar1]);
      lVar5 = lVar5 + 1;
      pVVar2 = p->vCos;
    } while (lVar5 < pVVar2->nSize);
  }
  Cnf_DataFree(p_00);
  return s;
}

Assistant:

sat_solver * Ifn_ManStrFindSolver( Gia_Man_t * p, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int i;    
    pCnf = Cnf_DeriveGiaRemapped( p );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // inputs/outputs
    *pvPiVars = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( *pvPiVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    *pvPoVars = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( *pvPoVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    Cnf_DataFree( pCnf );
    return pSat;
}